

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::SetupCustomTargets(cmQtAutoGenInitializer *this)

{
  bool bVar1;
  char *in_RCX;
  undefined1 auVar2 [16];
  string_view text;
  bool local_f1;
  string local_c0;
  cmAlphaNum local_a0;
  cmAlphaNum local_70;
  string local_40;
  Status local_20;
  cmQtAutoGenInitializer *local_18;
  cmQtAutoGenInitializer *this_local;
  
  local_18 = this;
  local_20 = cmsys::SystemTools::MakeDirectory(&(this->Dir).Info,(mode_t *)0x0);
  bVar1 = cmsys::Status::operator_cast_to_bool(&local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = MocOrUicEnabled(this);
    if ((!bVar1) || (bVar1 = SetupWriteAutogenInfo(this), bVar1)) {
      local_f1 = true;
      if (((this->Rcc).super_GenVarsT.Enabled & 1U) != 0) {
        local_f1 = SetupWriteRccInfo(this);
      }
      this_local._7_1_ = local_f1;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_70,"AutoGen: Could not create directory: ");
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->Dir);
    text._M_len = auVar2._8_8_;
    text._M_str = in_RCX;
    cmQtAutoGen::Quoted_abi_cxx11_(&local_c0,auVar2._0_8_,text);
    cmAlphaNum::cmAlphaNum(&local_a0,&local_c0);
    cmStrCat<>(&local_40,&local_70,&local_a0);
    cmSystemTools::Error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_c0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmQtAutoGenInitializer::SetupCustomTargets()
{
  // Create info directory on demand
  if (!cmSystemTools::MakeDirectory(this->Dir.Info)) {
    cmSystemTools::Error(cmStrCat("AutoGen: Could not create directory: ",
                                  Quoted(this->Dir.Info)));
    return false;
  }

  // Generate autogen target info file
  if (this->MocOrUicEnabled()) {
    // Write autogen target info files
    if (!this->SetupWriteAutogenInfo()) {
      return false;
    }
  }

  // Write AUTORCC info files
  return !this->Rcc.Enabled || this->SetupWriteRccInfo();
}